

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall
capnp::compiler::Compiler::Node::Node(Node *this,StringPtr name,Which kind,Reader genericParams)

{
  _Rb_tree_header *p_Var1;
  undefined6 in_register_0000000a;
  
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_00218780;
  this->module = (CompiledModule *)0x0;
  (this->parent).ptr = (Node *)0x0;
  (this->declaration)._reader.segment = (SegmentReader *)0x0;
  (this->declaration)._reader.capTable = (CapTableReader *)0x0;
  (this->declaration)._reader.data = (void *)0x0;
  (this->declaration)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->declaration)._reader.pointers + 6) = 0;
  (this->declaration)._reader.nestingLimit = 0x7fffffff;
  this->id = (CONCAT62(in_register_0000000a,kind) & 0xffffffff) + 1000;
  (this->displayName).content.ptr = name.content.ptr;
  (this->displayName).content.size_ = name.content.size_;
  this->kind = kind;
  this->genericParamCount = genericParams.reader.elementCount;
  this->isBuiltin = true;
  this->startByte = 0;
  this->endByte = 0;
  (this->guardedContent).state = STUB;
  p_Var1 = &(this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->guardedContent).orderedNestedNodes.builder.ptr = (Node **)0x0;
  (this->guardedContent).orderedNestedNodes.builder.pos =
       (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
  (this->guardedContent).orderedNestedNodes.builder.endPtr = (Node **)0x0;
  (this->guardedContent).orderedNestedNodes.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  p_Var1 = &(this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->guardedContent).bootstrapSchema.ptr.isSet = false;
  (this->guardedContent).finalSchema.ptr.isSet = false;
  (this->loadedFinalSchema).ptr.isSet = false;
  this->inGetContent = false;
  (this->guardedContent).sourceInfo.size_ = 0;
  (this->guardedContent).sourceInfo.disposer = (ArrayDisposer *)0x0;
  (this->guardedContent).auxSchemas.disposer = (ArrayDisposer *)0x0;
  (this->guardedContent).sourceInfo.ptr = (Reader *)0x0;
  (this->guardedContent).auxSchemas.ptr = (Reader *)0x0;
  (this->guardedContent).auxSchemas.size_ = 0;
  return;
}

Assistant:

Compiler::Node::Node(kj::StringPtr name, Declaration::Which kind,
                     List<Declaration::BrandParameter>::Reader genericParams)
    : module(nullptr),
      parent(kj::none),
      // It's helpful if these have unique IDs. Real type IDs can't be under 2^31 anyway.
      id(1000 + static_cast<uint>(kind)),
      displayName(name),
      kind(kind),
      genericParamCount(genericParams.size()),
      isBuiltin(true),
      startByte(0),
      endByte(0) {}